

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tt_InitFont(nk_tt_fontinfo *info,uchar *data2,int fontstart)

{
  uint uVar1;
  nk_ushort nVar2;
  nk_ushort nVar3;
  nk_uint nVar4;
  nk_uint nVar5;
  nk_uint encoding_record;
  nk_byte *data;
  int local_30;
  nk_int numTables;
  nk_int i;
  nk_uint t;
  nk_uint cmap;
  int fontstart_local;
  uchar *data2_local;
  nk_tt_fontinfo *info_local;
  
  info->data = data2;
  info->fontstart = fontstart;
  nVar4 = nk_tt__find_table(data2,fontstart,"cmap");
  nVar5 = nk_tt__find_table(data2,fontstart,"loca");
  info->loca = nVar5;
  nVar5 = nk_tt__find_table(data2,fontstart,"head");
  info->head = nVar5;
  nVar5 = nk_tt__find_table(data2,fontstart,"glyf");
  info->glyf = nVar5;
  nVar5 = nk_tt__find_table(data2,fontstart,"hhea");
  info->hhea = nVar5;
  nVar5 = nk_tt__find_table(data2,fontstart,"hmtx");
  info->hmtx = nVar5;
  nVar5 = nk_tt__find_table(data2,fontstart,"kern");
  info->kern = nVar5;
  if (((((nVar4 == 0) || (info->loca == 0)) || (info->head == 0)) ||
      ((info->glyf == 0 || (info->hhea == 0)))) || (info->hmtx == 0)) {
    info_local._4_4_ = 0;
  }
  else {
    nVar5 = nk_tt__find_table(data2,fontstart,"maxp");
    if (nVar5 == 0) {
      info->numGlyphs = 0xffff;
    }
    else {
      nVar2 = nk_ttUSHORT(data2 + (ulong)nVar5 + 4);
      info->numGlyphs = (uint)nVar2;
    }
    nVar2 = nk_ttUSHORT(data2 + (ulong)nVar4 + 2);
    info->index_map = 0;
    for (local_30 = 0; local_30 < (int)(uint)nVar2; local_30 = local_30 + 1) {
      uVar1 = nVar4 + 4 + local_30 * 8;
      nVar3 = nk_ttUSHORT(data2 + uVar1);
      if (nVar3 == 0) {
        nVar5 = nk_ttULONG(data2 + (ulong)uVar1 + 4);
        info->index_map = nVar4 + nVar5;
      }
      else if ((nVar3 == 3) &&
              ((nVar3 = nk_ttUSHORT(data2 + (ulong)uVar1 + 2), nVar3 == 1 || (nVar3 == 10)))) {
        nVar5 = nk_ttULONG(data2 + (ulong)uVar1 + 4);
        info->index_map = nVar4 + nVar5;
      }
    }
    if (info->index_map == 0) {
      info_local._4_4_ = 0;
    }
    else {
      nVar2 = nk_ttUSHORT(data2 + (long)info->head + 0x32);
      info->indexToLocFormat = (uint)nVar2;
      info_local._4_4_ = 1;
    }
  }
  return info_local._4_4_;
}

Assistant:

NK_INTERN int
nk_tt_InitFont(struct nk_tt_fontinfo *info, const unsigned char *data2, int fontstart)
{
    nk_uint cmap, t;
    nk_int i,numTables;
    const nk_byte *data = (const nk_byte *) data2;

    info->data = data;
    info->fontstart = fontstart;

    cmap = nk_tt__find_table(data, (nk_uint)fontstart, "cmap");       /* required */
    info->loca = (int)nk_tt__find_table(data, (nk_uint)fontstart, "loca"); /* required */
    info->head = (int)nk_tt__find_table(data, (nk_uint)fontstart, "head"); /* required */
    info->glyf = (int)nk_tt__find_table(data, (nk_uint)fontstart, "glyf"); /* required */
    info->hhea = (int)nk_tt__find_table(data, (nk_uint)fontstart, "hhea"); /* required */
    info->hmtx = (int)nk_tt__find_table(data, (nk_uint)fontstart, "hmtx"); /* required */
    info->kern = (int)nk_tt__find_table(data, (nk_uint)fontstart, "kern"); /* not required */
    if (!cmap || !info->loca || !info->head || !info->glyf || !info->hhea || !info->hmtx)
        return 0;

    t = nk_tt__find_table(data, (nk_uint)fontstart, "maxp");
    if (t) info->numGlyphs = nk_ttUSHORT(data+t+4);
    else info->numGlyphs = 0xffff;

    /* find a cmap encoding table we understand *now* to avoid searching */
    /* later. (todo: could make this installable) */
    /* the same regardless of glyph. */
    numTables = nk_ttUSHORT(data + cmap + 2);
    info->index_map = 0;
    for (i=0; i < numTables; ++i)
    {
        nk_uint encoding_record = cmap + 4 + 8 * (nk_uint)i;
        /* find an encoding we understand: */
        switch(nk_ttUSHORT(data+encoding_record)) {
        case NK_TT_PLATFORM_ID_MICROSOFT:
            switch (nk_ttUSHORT(data+encoding_record+2)) {
            case NK_TT_MS_EID_UNICODE_BMP:
            case NK_TT_MS_EID_UNICODE_FULL:
                /* MS/Unicode */
                info->index_map = (int)(cmap + nk_ttULONG(data+encoding_record+4));
                break;
            default: break;
            } break;
        case NK_TT_PLATFORM_ID_UNICODE:
            /* Mac/iOS has these */
            /* all the encodingIDs are unicode, so we don't bother to check it */
            info->index_map = (int)(cmap + nk_ttULONG(data+encoding_record+4));
            break;
        default: break;
        }
    }
    if (info->index_map == 0)
        return 0;
    info->indexToLocFormat = nk_ttUSHORT(data+info->head + 50);
    return 1;
}